

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsMotorTorque.cpp
# Opt level: O1

void __thiscall
chrono::ChShaftsMotorTorque::VariablesFbLoadForces(ChShaftsMotorTorque *this,double factor)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ulong *local_30;
  long local_28;
  
  dVar3 = (this->super_ChShaftsMotorBase).super_ChShaftsCouple.super_ChPhysicsItem.super_ChObj.
          ChTime;
  (*((this->f_torque).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[4])();
  ChVariables::Get_fb((ChVectorRef *)&local_30,
                      &(((this->super_ChShaftsMotorBase).super_ChShaftsCouple.shaft1)->variables).
                       super_ChVariables);
  if (0 < local_28) {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = *local_30;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = dVar3;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = factor;
    auVar1 = vfmadd231sd_fma(auVar4,auVar6,auVar1);
    *local_30 = auVar1._0_8_;
    ChVariables::Get_fb((ChVectorRef *)&local_30,
                        &(((this->super_ChShaftsMotorBase).super_ChShaftsCouple.shaft2)->variables).
                         super_ChVariables);
    if (0 < local_28) {
      auVar5._8_8_ = 0;
      auVar5._0_8_ = factor;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = dVar3;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *local_30;
      auVar1 = vfnmadd213sd_fma(auVar5,auVar7,auVar2);
      *local_30 = auVar1._0_8_;
      return;
    }
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, 1>::operator()(Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Level = 1]"
               );
}

Assistant:

void ChShaftsMotorTorque::VariablesFbLoadForces(double factor) {

    double imposed_torque = this->f_torque->Get_y(this->GetChTime());
    shaft1->Variables().Get_fb()(0) +=  imposed_torque * factor;
    shaft2->Variables().Get_fb()(0) += -imposed_torque * factor;
}